

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.h
# Opt level: O3

void __thiscall
args_t::args_t(args_t *this,
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  size_t sVar1;
  long lVar2;
  char **ppcVar3;
  char *pcVar4;
  ulong uVar5;
  _List_node_base *p_Var6;
  
  sVar1 = (args->
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl._M_node._M_size;
  this->argc = (int)sVar1;
  lVar2 = sVar1 << 0x20;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar2) {
    uVar5 = lVar2 >> 0x1d;
  }
  ppcVar3 = (char **)operator_new__(uVar5);
  this->argv = ppcVar3;
  p_Var6 = (args->
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)args) {
    lVar2 = 0;
    do {
      pcVar4 = string2chars((string *)(p_Var6 + 1));
      *(char **)((long)this->argv + lVar2) = pcVar4;
      p_Var6 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      lVar2 = lVar2 + 8;
    } while (p_Var6 != (_List_node_base *)args);
  }
  return;
}

Assistant:

args_t(std::list<string> args) {
        argc = static_cast<int>(args.size());
        argv = new char *[argc];
        std::list<string>::const_iterator iterator;
        int idx = 0;
        for (iterator = args.begin(); iterator != args.end(); ++iterator) {
            argv[idx] = string2chars((*iterator));
            idx++;
        }
    }